

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

bool __thiscall Board::solved(Board *this)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  char cVar5;
  char (*__range1) [3] [3];
  long lVar6;
  long lVar7;
  bool bVar8;
  
  pcVar3 = this->board[0] + 1;
  cVar5 = '0';
  lVar7 = 0;
  do {
    lVar6 = lVar7;
    if (lVar6 == 9) break;
    if (this->board[0][lVar6] == cVar5) {
      cVar1 = cVar5 + '\x03';
      lVar7 = 0;
      do {
        cVar4 = cVar5;
        bVar8 = lVar7 == 2;
        cVar5 = cVar1;
        if (bVar8) goto LAB_00111455;
        cVar5 = cVar4 + '\x01';
        pcVar2 = pcVar3 + lVar7;
        lVar7 = lVar7 + 1;
      } while (cVar5 == *pcVar2);
      cVar5 = cVar4 + '\x02';
    }
    else {
      cVar5 = cVar5 + '\x01';
      bVar8 = false;
    }
LAB_00111455:
    pcVar3 = pcVar3 + 3;
    lVar7 = lVar6 + 3;
  } while (bVar8);
  return lVar6 == 9;
}

Assistant:

bool Board::solved() const {
    char cur = '0';

    for (const Board::Row& row : board) {
        for (char tile : row) {
            if (tile != cur++) {
                return false;
            }
        }
    }

    return true;
}